

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O3

void construction_algorithm_parameters(void)

{
  node *pnVar1;
  initializer_list<std::array<float,_3UL>_> __l;
  initializer_list<std::array<float,_3UL>_> __l_00;
  initializer_list<std::array<float,_3UL>_> __l_01;
  initializer_list<std::array<float,_3UL>_> __l_02;
  max_leaf_size_t max_leaf_size;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree;
  allocator_type local_121;
  undefined8 local_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  undefined8 local_108;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_100;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_88;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_70;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_58;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_40;
  
  local_120 = 1;
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 1.0;
  uStack_110 = 0x4040000040000000;
  local_108 = 0x40a0000040800000;
  __l._M_len = 2;
  __l._M_array = (iterator)local_118;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&local_40,__l,&local_121);
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_100,&local_40,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_120,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)local_118,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_121);
  if (local_40.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_100);
  local_100.data_.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00107d98;
  while (local_100.data_.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_100.data_.allocator.resource_.head_)->prev;
    operator_delete(local_100.data_.allocator.resource_.head_,0x2008);
    local_100.data_.allocator.resource_.head_ = pnVar1;
  }
  if (local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.space_.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.space_.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_120 = 0;
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 1.0;
  uStack_110 = 0x4040000040000000;
  local_108 = 0x40a0000040800000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_118;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&local_58,__l_00,&local_121);
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_depth_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_100,&local_58,
             (splitter_stop_condition_t<pico_tree::max_leaf_depth_t> *)&local_120,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)local_118,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_121);
  if (local_58.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_100);
  local_100.data_.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00107d98;
  while (local_100.data_.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_100.data_.allocator.resource_.head_)->prev;
    operator_delete(local_100.data_.allocator.resource_.head_,0x2008);
    local_100.data_.allocator.resource_.head_ = pnVar1;
  }
  if (local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.space_.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.space_.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 1.0;
  uStack_110 = 0x4040000040000000;
  local_108 = 0x40a0000040800000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_118;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&local_70,__l_01,(allocator_type *)&local_120);
  local_120 = 1;
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 0.0;
  uStack_110 = 0x4110000000000000;
  local_108 = 0x4110000041100000;
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_t<std::array<float,3ul>>,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_100,&local_70,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_120,
             (splitter_start_bounds_t<pico_tree::bounds_t<std::array<float,_3UL>_>_> *)local_118,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_121);
  if (local_70.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_100);
  local_100.data_.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00107d98;
  while (local_100.data_.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_100.data_.allocator.resource_.head_)->prev;
    operator_delete(local_100.data_.allocator.resource_.head_,0x2008);
    local_100.data_.allocator.resource_.head_ = pnVar1;
  }
  if (local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.space_.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.space_.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 1.0;
  uStack_110 = 0x4040000040000000;
  local_108 = 0x40a0000040800000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_118;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&local_88,__l_02,(allocator_type *)&local_120);
  local_118._0_4_ = 1.4013e-45;
  local_118._4_4_ = 0.0;
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::median_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_100,&local_88,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)local_118,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)
             &pico_tree::bounds_from_space,
             (splitter_rule_t<pico_tree::median_max_side_t> *)&pico_tree::median_max_side);
  if (local_88.super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_100);
  local_100.data_.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00107d98;
  while (local_100.data_.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_100.data_.allocator.resource_.head_)->prev;
    operator_delete(local_100.data_.allocator.resource_.head_,0x2008);
    local_100.data_.allocator.resource_.head_ = pnVar1;
  }
  if (local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.data_.indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.space_.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.space_.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.space_.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void construction_algorithm_parameters() {
  {
    // Every point is a leaf in the resulting kd_tree.
    pico_tree::max_leaf_size_t max_leaf_size = 1;
    pico_tree::kd_tree tree(make_point_set(), max_leaf_size);
    query_tree(tree);
  }

  {
    // The resulting kd_tree has a depth of 0. I.e., the tree is a single leaf.
    pico_tree::max_leaf_depth_t max_leaf_depth = 0;
    pico_tree::kd_tree tree(make_point_set(), max_leaf_depth);
    query_tree(tree);
  }

  {
    // Setting a custom input bounds for the point cloud. The default argument
    // equals pico_tree::bounds_from_space. This determines the bounding box
    // from the input dataset. Setting a custom bounding box can make building
    // the tree a bit more efficient if the bounds for the input point set is
    // already known.
    pico_tree::kd_tree tree(
        make_point_set(),
        pico_tree::max_leaf_size_t(1),
        pico_tree::bounds_t(
            std::array{0.0f, 0.0f, 0.0f}, std::array{9.0f, 9.0f, 9.0f}));
    query_tree(tree);
  }

  {
    // Setting the split rule as the 4th argument. It can be one of:
    // * pico_tree::median_max_side
    // * pico_tree::midpoint_max_side
    // * pico_tree::sliding_midpoint_max_side
    // The default argument is pico_tree::sliding_midpoint_max_side.
    pico_tree::kd_tree tree(
        make_point_set(),
        pico_tree::max_leaf_size_t(1),
        pico_tree::bounds_from_space,
        pico_tree::median_max_side);
    query_tree(tree);
  }
}